

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O0

ustring * __thiscall dlib::tooltip::utext_abi_cxx11_(tooltip *this)

{
  bool bVar1;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *this_00
  ;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *in_RSI;
  ustring *in_RDI;
  ustring temp;
  auto_mutex M;
  rmutex *in_stack_ffffffffffffff78;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff80;
  allocator<unsigned_int> *in_stack_ffffffffffffffb0;
  uint *in_stack_ffffffffffffffb8;
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffffc0;
  
  auto_mutex::auto_mutex((auto_mutex *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(in_RSI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_> *)
                     0x453944);
  if (bVar1) {
    std::unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_>::operator->
              ((unique_ptr<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_> *)
               0x45395b);
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    operator=(in_stack_ffffffffffffff80,
              (basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
               *)in_stack_ffffffffffffff78);
  }
  this_00 = (basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
             *)std::__cxx11::
               basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
               ::c_str(in_stack_ffffffffffffff80);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x45399e);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x4539be);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(this_00);
  auto_mutex::~auto_mutex((auto_mutex *)0x4539d2);
  return in_RDI;
}

Assistant:

const dlib::ustring utext (
        ) const
        {
            auto_mutex M(m);
            dlib::ustring temp;
            if (stuff)
            {
                temp = stuff->win.text;
            }
            return temp.c_str();
        }